

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O3

void __thiscall
Lowerer::LowerOneBailOutKind
          (Lowerer *this,Instr *instr,BailOutKind bailOutKindToLower,bool isInHelperBlock,
          bool preserveBailOutKindInInstr)

{
  Func *func;
  code *pcVar1;
  bool bVar2;
  bool bVar3;
  BailOutKind BVar4;
  undefined4 *puVar5;
  BailOutInfo *bailOutInfo;
  Instr *pIVar6;
  BailOutInfo *pBVar7;
  BailOutInstrTemplate<IR::Instr> *this_00;
  BailOutKind BVar8;
  
  if (instr == (Instr *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x3347,"(instr)","instr");
    if (!bVar2) goto LAB_005d1467;
    *puVar5 = 0;
  }
  if (bailOutKindToLower == BailOutInvalid) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x3348,"(bailOutKindToLower)","bailOutKindToLower");
    if (!bVar2) goto LAB_005d1467;
    bVar2 = true;
LAB_005d12ac:
    *puVar5 = 0;
  }
  else {
    bVar2 = bailOutKindToLower < BailOutOnOverflow;
    if ((bailOutKindToLower & bailOutKindToLower - BailOutIntOnly) != BailOutInvalid && !bVar2) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar5 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                         ,0x3349,
                         "(!(bailOutKindToLower & IR::BailOutKindBits) || !(bailOutKindToLower & bailOutKindToLower - 1u))"
                         ,
                         "!(bailOutKindToLower & IR::BailOutKindBits) || !(bailOutKindToLower & bailOutKindToLower - 1u)"
                        );
      if (!bVar3) goto LAB_005d1467;
      goto LAB_005d12ac;
    }
  }
  func = instr->m_func;
  bailOutInfo = IR::Instr::GetBailOutInfo(instr);
  BVar4 = IR::Instr::GetBailOutKind(instr);
  BVar8 = (uint)((BVar4 & ~BailOutKindBits) == bailOutKindToLower);
  if (!bVar2) {
    BVar8 = BVar4 & bailOutKindToLower;
  }
  if (BVar8 == BailOutInvalid) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x3353,
                       "(bailOutKindToLower & IR::BailOutKindBits ? bailOutKind & bailOutKindToLower : (bailOutKind & ~IR::BailOutKindBits) == bailOutKindToLower)"
                       ,
                       "bailOutKindToLower & IR::BailOutKindBits ? bailOutKind & bailOutKindToLower : (bailOutKind & ~IR::BailOutKindBits) == bailOutKindToLower"
                      );
    if (!bVar2) goto LAB_005d1467;
    *puVar5 = 0;
  }
  BVar8 = BailOutInvalid;
  if (!preserveBailOutKindInInstr) {
    BVar8 = bailOutKindToLower;
  }
  if (BVar4 - BVar8 == BailOutInvalid) {
    IR::Instr::UnlinkBailOutInfo(instr);
    if (bailOutInfo->bailOutInstr == instr) {
      bailOutInfo->bailOutInstr = (Instr *)0x0;
    }
  }
  else {
    if (bailOutInfo->bailOutInstr == instr) {
      pIVar6 = IR::Instr::ShareBailOut(instr);
      pBVar7 = IR::Instr::GetBailOutInfo(pIVar6);
      if (pBVar7 != bailOutInfo) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar5 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                           ,0x335e,"(sharedBail->GetBailOutInfo() == bailOutInfo)",
                           "sharedBail->GetBailOutInfo() == bailOutInfo");
        if (!bVar2) {
LAB_005d1467:
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        *puVar5 = 0;
      }
      GenerateBailOut(this,pIVar6,(BranchInstr *)0x0,(LabelInstr *)0x0,(LabelInstr *)0x0);
    }
    IR::Instr::SetBailOutKind(instr,BVar4 - BVar8);
  }
  pIVar6 = instr->m_next;
  this_00 = IR::BailOutInstrTemplate<IR::Instr>::New(BailOut,bailOutKindToLower,bailOutInfo,func);
  IR::Instr::SetByteCodeOffset(&this_00->super_Instr,instr);
  IR::Instr::InsertBefore(pIVar6,&this_00->super_Instr);
  GenerateBailOut(this,&this_00->super_Instr,(BranchInstr *)0x0,(LabelInstr *)0x0,(LabelInstr *)0x0)
  ;
  return;
}

Assistant:

void Lowerer::LowerOneBailOutKind(
    IR::Instr *const instr,
    const IR::BailOutKind bailOutKindToLower,
    const bool isInHelperBlock,
    const bool preserveBailOutKindInInstr)
{
    Assert(instr);
    Assert(bailOutKindToLower);
    Assert(!(bailOutKindToLower & IR::BailOutKindBits) || !(bailOutKindToLower & bailOutKindToLower - 1u));

    Func *const func = instr->m_func;

    // Split bailouts other than the one being lowered here
    BailOutInfo *const bailOutInfo = instr->GetBailOutInfo();
    IR::BailOutKind bailOutKind = instr->GetBailOutKind();
    Assert(
        bailOutKindToLower & IR::BailOutKindBits
            ? bailOutKind & bailOutKindToLower
            : (bailOutKind & ~IR::BailOutKindBits) == bailOutKindToLower);
    if(!preserveBailOutKindInInstr)
    {
        bailOutKind -= bailOutKindToLower;
    }
    if(bailOutKind)
    {
        if(bailOutInfo->bailOutInstr == instr)
        {
            // Create a shared bailout point for the split bailout checks
            IR::Instr *const sharedBail = instr->ShareBailOut();
            Assert(sharedBail->GetBailOutInfo() == bailOutInfo);
            GenerateBailOut(sharedBail);
        }
        instr->SetBailOutKind(bailOutKind);
    }
    else
    {
        instr->UnlinkBailOutInfo();
        if(bailOutInfo->bailOutInstr == instr)
        {
            bailOutInfo->bailOutInstr = nullptr;
        }
    }

    IR::Instr *const insertBeforeInstr = instr->m_next;

    //     (Bail out with the requested bail out kind)
    IR::BailOutInstr *const bailOutInstr = IR::BailOutInstr::New(Js::OpCode::BailOut, bailOutKindToLower, bailOutInfo, func);
    bailOutInstr->SetByteCodeOffset(instr);
    insertBeforeInstr->InsertBefore(bailOutInstr);
    GenerateBailOut(bailOutInstr);

    // The caller is expected to generate code to decide whether to bail out
}